

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSolverApi.c
# Opt level: O2

void Msat_SolverClean(Msat_Solver_t *p,int nVars)

{
  uint uVar1;
  Msat_Clause_t **ppMVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  if (nVars <= p->nVarsAlloc) {
    p->nVars = nVars;
    p->nClauses = 0;
    uVar1 = Msat_ClauseVecReadSize(p->vClauses);
    ppMVar2 = Msat_ClauseVecReadArray(p->vClauses);
    uVar4 = 0;
    uVar3 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar3 = uVar4;
    }
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      Msat_ClauseFree(p,ppMVar2[uVar4],0);
    }
    Msat_ClauseVecClear(p->vClauses);
    uVar1 = Msat_ClauseVecReadSize(p->vLearned);
    ppMVar2 = Msat_ClauseVecReadArray(p->vLearned);
    uVar4 = 0;
    uVar3 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar3 = uVar4;
    }
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      Msat_ClauseFree(p,ppMVar2[uVar4],0);
    }
    Msat_ClauseVecClear(p->vLearned);
    uVar1 = p->nVars;
    uVar3 = 0;
    uVar4 = 0;
    if (0 < (int)uVar1) {
      uVar4 = (ulong)uVar1;
    }
    for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      p->pdActivity[uVar3] = 0.0;
    }
    Msat_OrderSetBounds(p->pOrder,uVar1);
    for (lVar5 = 0; SBORROW8(lVar5,(long)p->nVars * 2) != lVar5 + (long)p->nVars * -2 < 0;
        lVar5 = lVar5 + 1) {
      Msat_ClauseVecClear(p->pvWatched[lVar5]);
    }
    Msat_QueueClear(p->pQueue);
    for (lVar5 = 0; lVar5 < p->nVars; lVar5 = lVar5 + 1) {
      p->pAssigns[lVar5] = -1;
    }
    Msat_IntVecClear(p->vTrail);
    Msat_IntVecClear(p->vTrailLim);
    memset(p->pReasons,0,(long)p->nVars << 3);
    for (lVar5 = 0; lVar5 < p->nVars; lVar5 = lVar5 + 1) {
      p->pLevel[lVar5] = -1;
    }
    p->dRandSeed = 91648253.0;
    p->dProgress = 0.0;
    memset(p->pSeen,0,(long)p->nVars << 2);
    p->nSeenId = 1;
    Msat_IntVecClear(p->vReason);
    Msat_IntVecClear(p->vTemp);
    return;
  }
  __assert_fail("p->nVarsAlloc >= nVars",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/msat/msatSolverApi.c"
                ,0x13a,"void Msat_SolverClean(Msat_Solver_t *, int)");
}

Assistant:

void Msat_SolverClean( Msat_Solver_t * p, int nVars )
{
    int i;
    // free the clauses
    int nClauses;
    Msat_Clause_t ** pClauses;

    assert( p->nVarsAlloc >= nVars );
    p->nVars    = nVars;
    p->nClauses = 0;

    nClauses = Msat_ClauseVecReadSize( p->vClauses );
    pClauses = Msat_ClauseVecReadArray( p->vClauses );
    for ( i = 0; i < nClauses; i++ )
        Msat_ClauseFree( p, pClauses[i], 0 );
//    Msat_ClauseVecFree( p->vClauses );
    Msat_ClauseVecClear( p->vClauses );

    nClauses = Msat_ClauseVecReadSize( p->vLearned );
    pClauses = Msat_ClauseVecReadArray( p->vLearned );
    for ( i = 0; i < nClauses; i++ )
        Msat_ClauseFree( p, pClauses[i], 0 );
//    Msat_ClauseVecFree( p->vLearned );
    Msat_ClauseVecClear( p->vLearned );

//    ABC_FREE( p->pdActivity );
    for ( i = 0; i < p->nVars; i++ )
        p->pdActivity[i] = 0;

//    Msat_OrderFree( p->pOrder );
//    Msat_OrderClean( p->pOrder, p->nVars, NULL );
    Msat_OrderSetBounds( p->pOrder, p->nVars );

    for ( i = 0; i < 2 * p->nVars; i++ )
//        Msat_ClauseVecFree( p->pvWatched[i] );
        Msat_ClauseVecClear( p->pvWatched[i] );
//    ABC_FREE( p->pvWatched );
//    Msat_QueueFree( p->pQueue );
    Msat_QueueClear( p->pQueue );

//    ABC_FREE( p->pAssigns );
    for ( i = 0; i < p->nVars; i++ )
        p->pAssigns[i] = MSAT_VAR_UNASSIGNED;
//    Msat_IntVecFree( p->vTrail );
    Msat_IntVecClear( p->vTrail );
//    Msat_IntVecFree( p->vTrailLim );
    Msat_IntVecClear( p->vTrailLim );
//    ABC_FREE( p->pReasons );
    memset( p->pReasons, 0, sizeof(Msat_Clause_t *) * p->nVars );
//    ABC_FREE( p->pLevel );
    for ( i = 0; i < p->nVars; i++ )
        p->pLevel[i] = -1;
//    Msat_IntVecFree( p->pModel );
//    Msat_MmStepStop( p->pMem, 0 );
    p->dRandSeed = 91648253;
    p->dProgress = 0.0;

//    ABC_FREE( p->pSeen );
    memset( p->pSeen, 0, sizeof(int) * p->nVars );
    p->nSeenId = 1;
//    Msat_IntVecFree( p->vReason );
    Msat_IntVecClear( p->vReason );
//    Msat_IntVecFree( p->vTemp );
    Msat_IntVecClear( p->vTemp );
//    printf(" The number of clauses remaining = %d (%d).\n", p->nClausesAlloc, p->nClausesAllocL );
//    ABC_FREE( p );
}